

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O3

unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true> __thiscall
duckdb::CopyDatabaseInfo::Deserialize(CopyDatabaseInfo *this,Deserializer *deserializer)

{
  pointer *ppuVar1;
  uint uVar2;
  pointer pCVar3;
  _Head_base<0UL,_duckdb::CopyDatabaseInfo_*,_false> local_70;
  vector<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
  local_68;
  vector<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
  local_48;
  
  local_70._M_head_impl = (CopyDatabaseInfo *)operator_new(0x48);
  ((local_70._M_head_impl)->super_ParseInfo).info_type = COPY_DATABASE_INFO;
  ((local_70._M_head_impl)->super_ParseInfo)._vptr_ParseInfo =
       (_func_int **)&PTR__CopyDatabaseInfo_024462d0;
  ((local_70._M_head_impl)->target_database)._M_dataplus._M_p =
       (pointer)&((local_70._M_head_impl)->target_database).field_2;
  ((local_70._M_head_impl)->target_database)._M_string_length = 0;
  ((local_70._M_head_impl)->target_database).field_2._M_local_buf[0] = '\0';
  ((local_70._M_head_impl)->entries).
  super_vector<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_70._M_head_impl)->entries).
  super_vector<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_70._M_head_impl)->entries).
  super_vector<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pCVar3 = unique_ptr<duckdb::CopyDatabaseInfo,_std::default_delete<duckdb::CopyDatabaseInfo>,_true>
           ::operator->((unique_ptr<duckdb::CopyDatabaseInfo,_std::default_delete<duckdb::CopyDatabaseInfo>,_true>
                         *)&local_70);
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"target_database");
  if ((char)uVar2 == '\0') {
    ppuVar1 = &local_68.
               super__Vector_base<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_68.
    super__Vector_base<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.
    super__Vector_base<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((ulong)local_68.
                          super__Vector_base<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
    local_68.
    super__Vector_base<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppuVar1;
    ::std::__cxx11::string::operator=((string *)&pCVar3->target_database,(string *)&local_68);
    if (local_68.
        super__Vector_base<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start == (pointer)ppuVar1) goto LAB_010a38b1;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_68,deserializer);
    ::std::__cxx11::string::operator=((string *)&pCVar3->target_database,(string *)&local_68);
    if (local_68.
        super__Vector_base<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (pointer)&local_68.
                  super__Vector_base<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_010a38b1;
  }
  operator_delete(local_68.
                  super__Vector_base<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start);
LAB_010a38b1:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  pCVar3 = unique_ptr<duckdb::CopyDatabaseInfo,_std::default_delete<duckdb::CopyDatabaseInfo>,_true>
           ::operator->((unique_ptr<duckdb::CopyDatabaseInfo,_std::default_delete<duckdb::CopyDatabaseInfo>,_true>
                         *)&local_70);
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xc9,"entries");
  if ((char)uVar2 == '\0') {
    local_68.
    super__Vector_base<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pCVar3->entries).
         super_vector<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_68.
    super__Vector_base<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pCVar3->entries).
         super_vector<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_68.
    super__Vector_base<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pCVar3->entries).
         super_vector<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (pCVar3->entries).
    super_vector<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pCVar3->entries).
    super_vector<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pCVar3->entries).
    super_vector<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.
    super__Vector_base<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super__Vector_base<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.
    super__Vector_base<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
    ::~vector(&local_68);
  }
  else {
    Deserializer::
    Read<duckdb::vector<duckdb::unique_ptr<duckdb::CreateInfo,std::default_delete<duckdb::CreateInfo>,true>,true>>
              ((type *)&local_48,deserializer);
    local_68.
    super__Vector_base<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pCVar3->entries).
         super_vector<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (pCVar3->entries).
    super_vector<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_48.
         super__Vector_base<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_68.
    super__Vector_base<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pCVar3->entries).
         super_vector<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_68.
    super__Vector_base<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pCVar3->entries).
         super_vector<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (pCVar3->entries).
    super_vector<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_48.
         super__Vector_base<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (pCVar3->entries).
    super_vector<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_48.
         super__Vector_base<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_48.
    super__Vector_base<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super__Vector_base<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.
    super__Vector_base<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
    ::~vector(&local_68);
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
  ::~vector(&local_48);
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  (this->super_ParseInfo)._vptr_ParseInfo = (_func_int **)local_70._M_head_impl;
  return (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>)
         (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>)this;
}

Assistant:

unique_ptr<ParseInfo> CopyDatabaseInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<CopyDatabaseInfo>(new CopyDatabaseInfo());
	deserializer.ReadPropertyWithDefault<string>(200, "target_database", result->target_database);
	deserializer.ReadPropertyWithDefault<vector<unique_ptr<CreateInfo>>>(201, "entries", result->entries);
	return std::move(result);
}